

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamEnumerates.hpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>_>
* TasDREAM::IO::getStringRuleMap_abi_cxx11_(void)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>
  __l;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>_>
  *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  *local_190;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>
  local_16e;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_16d;
  TypeDistribution local_16c [10];
  TypeDistribution local_144;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  *local_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  local_48;
  iterator local_20;
  size_type local_18;
  
  local_140 = &local_138;
  local_144 = dist_null;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  ::pair<const_char_(&)[5],_TasDREAM::TypeDistribution,_true>
            (local_140,(char (*) [5])"null",&local_144);
  local_140 = &local_110;
  local_16c[5] = 5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  ::pair<const_char_(&)[5],_TasDREAM::TypeDistribution,_true>
            (local_140,(char (*) [5])"none",local_16c + 5);
  local_140 = &local_e8;
  local_16c[4] = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  ::pair<const_char_(&)[8],_TasDREAM::TypeDistribution,_true>
            (local_140,(char (*) [8])"uniform",local_16c + 4);
  local_140 = &local_c0;
  local_16c[3] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  ::pair<const_char_(&)[9],_TasDREAM::TypeDistribution,_true>
            (local_140,(char (*) [9])"gaussian",local_16c + 3);
  local_140 = &local_98;
  local_16c[2] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  ::pair<const_char_(&)[12],_TasDREAM::TypeDistribution,_true>
            (local_140,(char (*) [12])"exponential",local_16c + 2);
  local_140 = &local_70;
  local_16c[1] = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  ::pair<const_char_(&)[5],_TasDREAM::TypeDistribution,_true>
            (local_140,(char (*) [5])"beta",local_16c + 1);
  local_140 = &local_48;
  local_16c[0] = dist_gamma;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  ::pair<const_char_(&)[6],_TasDREAM::TypeDistribution,_true>
            (local_140,(char (*) [6])"gamma",local_16c);
  local_20 = &local_138;
  local_18 = 7;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>
  ::allocator(&local_16e);
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>_>
  ::map(in_RDI,__l,&local_16d,&local_16e);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>
  ::~allocator(&local_16e);
  local_190 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
               *)&local_20;
  do {
    local_190 = local_190 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
    ::~pair(local_190);
  } while (local_190 != &local_138);
  return in_RDI;
}

Assistant:

inline std::map<std::string, TypeDistribution> getStringRuleMap(){
        return std::initializer_list<std::pair<std::string const, TypeDistribution>>{
            {"null",        dist_null},
            {"none",        dist_none},
            {"uniform",     dist_uniform},
            {"gaussian",    dist_gaussian},
            {"exponential", dist_exponential},
            {"beta",        dist_beta},
            {"gamma",       dist_gamma}};
    }